

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O0

TProb<double> * __thiscall libDAI::TProb<double>::log0(TProb<double> *this)

{
  size_t sVar1;
  const_reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RSI;
  TProb<double> *in_RDI;
  size_t i;
  TProb<double> *l0;
  value_type_conflict3 *in_stack_ffffffffffffff98;
  TProb<double> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *this_00;
  size_type in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  ulong uVar3;
  ulong __n;
  
  TProb(in_stack_ffffffffffffffa0);
  size((TProb<double> *)0xb541b9);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  uVar3 = 0;
  while (__n = uVar3, sVar1 = size((TProb<double> *)0xb541e5), uVar3 < sVar1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,__n);
    if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,__n);
      this_00 = (vector<double,_std::allocator<double>_> *)::log(*pvVar2);
    }
    else {
      this_00 = (vector<double,_std::allocator<double>_> *)0x0;
    }
    std::vector<double,_std::allocator<double>_>::push_back(this_00,in_stack_ffffffffffffff98);
    uVar3 = __n + 1;
  }
  return in_RDI;
}

Assistant:

TProb<T> log0() const {
                TProb<T> l0;
                l0._p.reserve( size() );
                for( size_t i = 0; i < size(); i++ )
                    l0._p.push_back( (_p[i] == 0.0) ? 0.0 : std::log( _p[i] ) );
                return l0;
            }